

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_transaction.cpp
# Opt level: O3

int CfdUpdateWitnessStack
              (void *handle,void *create_handle,int stack_type,char *txid,uint32_t vout,
              uint32_t stack_index,char *stack_item)

{
  ConfidentialTransaction *this;
  bool bVar1;
  uint32_t uVar2;
  size_t sVar3;
  CfdException *pCVar4;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *this_00;
  TransactionContext *tx;
  bool is_bitcoin;
  Txid txid_obj;
  bool local_101;
  OutPoint local_100;
  ByteData local_d8;
  void *local_c0;
  int local_b4;
  Txid local_b0;
  ScriptWitness local_90;
  ScriptWitness local_70;
  ScriptWitness local_50;
  
  local_c0 = handle;
  local_b4 = stack_type;
  cfd::Initialize();
  local_100.txid_._vptr_Txid =
       (_func_int **)
       &local_100.txid_.data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"TransactionData","");
  cfd::capi::CheckBuffer(create_handle,(string *)&local_100);
  if (local_100.txid_._vptr_Txid !=
      (_func_int **)
      &local_100.txid_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
       ._M_impl.super__Vector_impl_data._M_finish) {
    operator_delete(local_100.txid_._vptr_Txid);
  }
  if (stack_item == (char *)0x0) {
    local_100.txid_._vptr_Txid = (_func_int **)0x5e44da;
    local_100.txid_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start._0_4_ = 0x27b;
    local_100.txid_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish = "CfdUpdateWitnessStack";
    cfd::core::logger::log<>
              ((CfdSourceLocation *)&local_100,kCfdLogLevelWarning,"stack_item is null or empty.");
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    local_100.txid_._vptr_Txid =
         (_func_int **)
         &local_100.txid_.data_.data_.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_100,"Failed to parameter. stack_item is null or empty.","");
    cfd::core::CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)&local_100);
    __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar1 = cfd::capi::IsEmptyString(txid);
  if (bVar1) {
    local_100.txid_._vptr_Txid = (_func_int **)0x5e44da;
    local_100.txid_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start._0_4_ = 0x281;
    local_100.txid_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish = "CfdUpdateWitnessStack";
    cfd::core::logger::log<>
              ((CfdSourceLocation *)&local_100,kCfdLogLevelWarning,"txid is null or empty.");
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    local_100.txid_._vptr_Txid =
         (_func_int **)
         &local_100.txid_.data_.data_.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_100,"Failed to parameter. txid is null or empty.","");
    cfd::core::CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)&local_100);
    __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  std::__cxx11::string::string((string *)&local_100,txid,(allocator *)&local_d8);
  cfd::core::Txid::Txid(&local_b0,(string *)&local_100);
  if (local_100.txid_._vptr_Txid !=
      (_func_int **)
      &local_100.txid_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
       ._M_impl.super__Vector_impl_data._M_finish) {
    operator_delete(local_100.txid_._vptr_Txid);
  }
  local_101 = false;
  cfd::capi::ConvertNetType(*(int *)((long)create_handle + 0x10),&local_101);
  this = *(ConfidentialTransaction **)((long)create_handle + 0x18);
  if (this != (ConfidentialTransaction *)0x0) {
    if (local_101 == true) {
      cfd::core::OutPoint::OutPoint(&local_100,&local_b0,vout);
      uVar2 = (*(this->super_AbstractTransaction)._vptr_AbstractTransaction[0xf])(this,&local_100);
      local_100.txid_._vptr_Txid = (_func_int **)&PTR__Txid_00723450;
      if ((void *)CONCAT44(local_100.txid_.data_.data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start._4_4_,
                           local_100.txid_.data_.data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start._0_4_) != (void *)0x0) {
        operator_delete((void *)CONCAT44(local_100.txid_.data_.data_.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                         local_100.txid_.data_.data_.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start._0_4_));
      }
      local_100.txid_._vptr_Txid =
           (_func_int **)
           &local_100.txid_.data_.data_.
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish;
      sVar3 = strlen(stack_item);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_100,stack_item,stack_item + sVar3);
      cfd::core::ByteData::ByteData(&local_d8,(string *)&local_100);
      cfd::core::Transaction::SetScriptWitnessStack
                (&local_50,(Transaction *)this,uVar2,stack_index,&local_d8);
      this_00 = &local_50.witness_stack_;
    }
    else {
      cfd::core::OutPoint::OutPoint(&local_100,&local_b0,vout);
      uVar2 = (*(this->super_AbstractTransaction)._vptr_AbstractTransaction[0xf])(this,&local_100);
      local_100.txid_._vptr_Txid = (_func_int **)&PTR__Txid_00723450;
      if ((void *)CONCAT44(local_100.txid_.data_.data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start._4_4_,
                           local_100.txid_.data_.data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start._0_4_) != (void *)0x0) {
        operator_delete((void *)CONCAT44(local_100.txid_.data_.data_.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                         local_100.txid_.data_.data_.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start._0_4_));
      }
      if (stack_type == 1) {
        local_100.txid_._vptr_Txid =
             (_func_int **)
             &local_100.txid_.data_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish;
        sVar3 = strlen(stack_item);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_100,stack_item,stack_item + sVar3);
        cfd::core::ByteData::ByteData(&local_d8,(string *)&local_100);
        cfd::core::ConfidentialTransaction::SetPeginWitnessStack
                  (&local_90,this,uVar2,stack_index,&local_d8);
        this_00 = &local_90.witness_stack_;
      }
      else {
        if (stack_type != 0) {
          local_100.txid_._vptr_Txid = (_func_int **)0x5e44da;
          local_100.txid_.data_.data_.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start._0_4_ = 0x29c;
          local_100.txid_.data_.data_.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish = "CfdUpdateWitnessStack";
          cfd::core::logger::log<int&>
                    ((CfdSourceLocation *)&local_100,kCfdLogLevelWarning,"Invalid stack type[{}]",
                     &local_b4);
          pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
          local_100.txid_._vptr_Txid =
               (_func_int **)
               &local_100.txid_.data_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_100,"Invalid stack type.","");
          cfd::core::CfdException::CfdException
                    (pCVar4,kCfdIllegalArgumentError,(string *)&local_100);
          __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,
                      cfd::core::CfdException::~CfdException);
        }
        local_100.txid_._vptr_Txid =
             (_func_int **)
             &local_100.txid_.data_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish;
        sVar3 = strlen(stack_item);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_100,stack_item,stack_item + sVar3);
        cfd::core::ByteData::ByteData(&local_d8,(string *)&local_100);
        cfd::core::ConfidentialTransaction::SetScriptWitnessStack
                  (&local_70,this,uVar2,stack_index,&local_d8);
        this_00 = &local_70.witness_stack_;
      }
    }
    *(undefined ***)((long)(this_00 + -1) + 0x10) = &PTR__ScriptWitness_00723678;
    std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector(this_00);
    if (local_d8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_d8.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_100.txid_._vptr_Txid !=
        (_func_int **)
        &local_100.txid_.data_.data_.
         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_finish) {
      operator_delete(local_100.txid_._vptr_Txid);
    }
    local_b0._vptr_Txid = (_func_int **)&PTR__Txid_00723450;
    if (local_b0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_b0.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    return 0;
  }
  pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
  local_100.txid_._vptr_Txid =
       (_func_int **)
       &local_100.txid_.data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_100,"Invalid handle state. tx is null","");
  cfd::core::CfdException::CfdException(pCVar4,kCfdIllegalStateError,(string *)&local_100);
  __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdUpdateWitnessStack(
    void* handle, void* create_handle, int stack_type, const char* txid,
    uint32_t vout, uint32_t stack_index, const char* stack_item) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    CheckBuffer(create_handle, kPrefixTransactionData);
    CfdCapiTransactionData* tx_data =
        static_cast<CfdCapiTransactionData*>(create_handle);
    if (stack_item == nullptr) {
      warn(CFD_LOG_SOURCE, "stack_item is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. stack_item is null or empty.");
    }
    if (IsEmptyString(txid)) {
      warn(CFD_LOG_SOURCE, "txid is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. txid is null or empty.");
    }

    Txid txid_obj(txid);
    bool is_bitcoin = false;
    ConvertNetType(tx_data->net_type, &is_bitcoin);
    if (tx_data->tx_obj == nullptr) {
      throw CfdException(
          CfdError::kCfdIllegalStateError, "Invalid handle state. tx is null");
    } else if (is_bitcoin) {
      TransactionContext* tx =
          static_cast<TransactionContext*>(tx_data->tx_obj);
      uint32_t index = tx->GetTxInIndex(OutPoint(txid_obj, vout));
      tx->SetScriptWitnessStack(index, stack_index, ByteData(stack_item));
    } else {
#ifndef CFD_DISABLE_ELEMENTS
      ConfidentialTransactionContext* tx =
          static_cast<ConfidentialTransactionContext*>(tx_data->tx_obj);
      uint32_t index = tx->GetTxInIndex(OutPoint(txid_obj, vout));
      if (stack_type == kCfdTxWitnessStackNormal) {
        tx->SetScriptWitnessStack(index, stack_index, ByteData(stack_item));
      } else if (stack_type == kCfdTxWitnessStackPegin) {
        tx->SetPeginWitnessStack(index, stack_index, ByteData(stack_item));
      } else {
        warn(CFD_LOG_SOURCE, "Invalid stack type[{}]", stack_type);
        throw CfdException(
            CfdError::kCfdIllegalArgumentError, "Invalid stack type.");
      }
#else
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Elements is not supported.");
#endif  // CFD_DISABLE_ELEMENTS
    }

    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}